

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O0

void __thiscall HighsMipAnalysis::setupMipTime(HighsMipAnalysis *this,HighsOptions *options)

{
  long in_RSI;
  HighsTimerClock *in_RDI;
  MipTimer mip_timer;
  HighsTimerClock clock;
  HighsTimerClock *in_stack_000000a8;
  MipTimer *in_stack_000000b0;
  HighsTimerClock *pHVar1;
  HighsTimerClock local_30;
  
  *(bool *)&in_RDI[2].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (*(uint *)(in_RSI + 0x160) & 0x80) != 0;
  if (((ulong)in_RDI[2].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    pHVar1 = &local_30;
    HighsTimerClock::HighsTimerClock((HighsTimerClock *)0x60fbf9);
    local_30.timer_pointer_ = in_RDI->timer_pointer_;
    MipTimer::initialiseMipClocks(in_stack_000000b0,in_stack_000000a8);
    HighsTimerClock::operator=(in_RDI,pHVar1);
    HighsTimerClock::~HighsTimerClock((HighsTimerClock *)0x60fc35);
  }
  return;
}

Assistant:

void HighsMipAnalysis::setupMipTime(const HighsOptions& options) {
  analyse_mip_time = kHighsAnalysisLevelMipTime & options.highs_analysis_level;
  if (analyse_mip_time) {
    HighsTimerClock clock;
    clock.timer_pointer_ = timer_;
    MipTimer mip_timer;
    mip_timer.initialiseMipClocks(clock);
    mip_clocks = clock;
  }
}